

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

void Saig_ManCexMinVerifyPhase(Aig_Man_t *pAig,Abc_Cex_t *pCex,int f)

{
  undefined1 *puVar1;
  ulong *puVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  if (0 < pAig->nTruePis) {
    lVar7 = 0;
    do {
      if (pAig->vCis->nSize <= lVar7) goto LAB_004ff4a2;
      pvVar4 = pAig->vCis->pArray[lVar7];
      lVar9 = (ulong)(uint)(pCex->nPis * f + pCex->nRegs) + lVar7;
      *(ulong *)((long)pvVar4 + 0x18) =
           (*(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffff7) +
           (ulong)((uint)(&pCex[1].iPo)[(int)lVar9 >> 5] >> ((byte)lVar9 & 0x1f) & 1) * 8;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pAig->nTruePis);
  }
  if (f == 0) {
    if (0 < pAig->nRegs) {
      iVar6 = 0;
      do {
        uVar8 = pAig->nTruePis + iVar6;
        if (((int)uVar8 < 0) || (pAig->vCis->nSize <= (int)uVar8)) goto LAB_004ff4a2;
        puVar2 = (ulong *)((long)pAig->vCis->pArray[uVar8] + 0x18);
        *puVar2 = *puVar2 & 0xfffffffffffffff7;
        iVar6 = iVar6 + 1;
      } while (iVar6 < pAig->nRegs);
    }
  }
  else if (0 < pAig->nRegs) {
    iVar6 = 0;
    do {
      iVar3 = pAig->nTruePis;
      uVar8 = iVar6 + iVar3;
      if (((int)uVar8 < 0) || (pAig->vCis->nSize <= (int)uVar8)) {
LAB_004ff4a2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar5 = (int *)pAig->vCis->pArray[uVar8];
      if ((((uint)*(ulong *)(piVar5 + 6) & 7) != 2) || (*piVar5 < iVar3)) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar8 = (*piVar5 - iVar3) + pAig->nTruePos;
      if (((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) goto LAB_004ff4a2;
      *(ulong *)(piVar5 + 6) =
           *(ulong *)(piVar5 + 6) & 0xfffffffffffffff2 |
           (ulong)((uint)*(undefined8 *)((long)pAig->vCos->pArray[uVar8] + 0x18) & 8);
      iVar6 = iVar6 + 1;
    } while (iVar6 < pAig->nRegs);
  }
  pVVar10 = pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar7 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar7];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar4 + 0x18) =
             (*(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffff7) +
             (ulong)((*(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3
                     ^ (uint)*(ulong *)((long)pvVar4 + 0x10)) &
                     (*(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) >> 3 ^
                     (uint)*(ulong *)((long)pvVar4 + 8)) & 1) * 8;
      }
      lVar7 = lVar7 + 1;
      pVVar10 = pAig->vObjs;
    } while (lVar7 < pVVar10->nSize);
  }
  pVVar10 = pAig->vCos;
  if (0 < pVVar10->nSize) {
    lVar7 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar7];
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffff7 |
           (ulong)(((int)*(ulong *)((long)pvVar4 + 8) << 3 ^
                   *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18)) & 8);
      lVar7 = lVar7 + 1;
      pVVar10 = pAig->vCos;
    } while (lVar7 < pVVar10->nSize);
  }
  return;
}

Assistant:

void Saig_ManCexMinVerifyPhase( Aig_Man_t * pAig, Abc_Cex_t * pCex, int f )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManConst1(pAig)->fPhase = 1;
    Saig_ManForEachPi( pAig, pObj, i )
        pObj->fPhase = Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + i);
    if ( f == 0 )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->fPhase = 0;
    }
    else
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->fPhase = Saig_ObjLoToLi(pAig, pObj)->fPhase;
    }
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->fPhase = (Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase) & 
                       (Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase);
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->fPhase = (Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase);
}